

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

Reg ra_dest(ASMState *as,IRIns *ir,RegSet allow)

{
  byte bVar1;
  uint uVar2;
  Reg r;
  
  bVar1 = (ir->field_1).r;
  r = (Reg)bVar1;
  if (-1 < (char)bVar1) {
    uVar2 = 1 << (bVar1 & 0x1f);
    as->freeset = as->freeset | uVar2;
    as->modset = as->modset | uVar2;
    goto LAB_00146596;
  }
  if (bVar1 < 0xfd) {
    r = bVar1 & 0x7f;
    if (((as->freeset & allow) >> (bVar1 & 0x1f) & 1) == 0) goto LAB_00146586;
    as->modset = as->modset | 1 << ((byte)r & 0x1f);
  }
  else {
LAB_00146586:
    r = ra_scratch(as,allow);
  }
  (ir->field_1).r = (uint8_t)r;
LAB_00146596:
  if ((ir->field_1).s != 0) {
    emit_storeofs(as,ir,r,4,(uint)(ir->field_1).s << 2);
  }
  return r;
}

Assistant:

static Reg ra_dest(ASMState *as, IRIns *ir, RegSet allow)
{
  Reg dest = ir->r;
  if (ra_hasreg(dest)) {
    ra_free(as, dest);
    ra_modified(as, dest);
  } else {
    if (ra_hashint(dest) && rset_test((as->freeset&allow), ra_gethint(dest))) {
      dest = ra_gethint(dest);
      ra_modified(as, dest);
      RA_DBGX((as, "dest           $r", dest));
    } else {
      dest = ra_scratch(as, allow);
    }
    ir->r = dest;
  }
  if (LJ_UNLIKELY(ra_hasspill(ir->s))) ra_save(as, ir, dest);
  return dest;
}